

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket_p.cpp
# Opt level: O3

int64_t __thiscall BamTools::Internal::TcpSocket::Read(TcpSocket *this,char *data,uint numBytes)

{
  bool bVar1;
  int64_t iVar2;
  size_t sVar3;
  
  bVar1 = RollingBuffer::IsEmpty(&this->m_readBuffer);
  if (bVar1) {
    if (this->m_engine != (TcpSocketEngine *)0x0) {
      iVar2 = ReadFromSocket(this);
      if (-1 < iVar2) goto LAB_00151c8a;
    }
    return -1;
  }
LAB_00151c8a:
  sVar3 = RollingBuffer::Read(&this->m_readBuffer,data,(ulong)numBytes);
  return sVar3;
}

Assistant:

int64_t TcpSocket::Read(char* data, const unsigned int numBytes) {

    // if we have data in buffer, just return it
    if ( !m_readBuffer.IsEmpty() ) {
        const size_t bytesRead = m_readBuffer.Read(data, numBytes);
        return static_cast<int64_t>(bytesRead);
    }

    // otherwise, we'll need to fetch data from socket
    // first make sure we have a valid socket engine
    if ( m_engine == 0 ) {
        // TODO: set error string/state?
        return -1;
    }

    // fetch data from socket, return 0 for success, -1 for failure
    // since this should be called in a loop,
    // we'll pull the actual bytes from the buffer on next iteration
    const int64_t socketBytesRead = ReadFromSocket();
    if ( socketBytesRead < 0 ) {
        // TODO: set error string/state ?
        return -1;
    }

    // we should have data now in buffer, try to fetch requested amount
    // if nothing in buffer, we will return 0 bytes read (signals EOF reached)
    const size_t numBytesRead = m_readBuffer.Read(data, numBytes);
    return static_cast<int64_t>(numBytesRead);
}